

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_appendCString_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"01234",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_appendCString(&string,"5678",4);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x3d5,"Assertion \'AString_appendCString(&string, \"5678\", 4)\' failed",0,0)
    ;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x3d5);
  if (string.capacity == 0x10) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x3d6);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x3d6);
      pcVar6 = string.buffer;
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        pcVar6 = "(null)";
      }
      else {
        iVar2 = strcmp("012345678",string.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x3d6);
          if (string.size == 9) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x3d6);
            if (private_ACUtilsTest_AString_reallocCount == 1) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x3d7);
              (*string.deallocator)(string.buffer);
              return;
            }
            pcVar6 = "(1)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount == (1)";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x3d7;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_0012b70c;
          }
          pcVar6 = "strlen(\"012345678\")";
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar4 = "(string).size == strlen(\"012345678\")";
          pcVar5 = "(string).size";
          goto LAB_0012b707;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\"012345678\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    pcVar6 = "(16)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (16)";
    pcVar5 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_0012b707:
  iVar2 = 0x3d6;
LAB_0012b70c:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5,string.size,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_appendCString_success_notEnoughCapacity)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_appendCString(&string, "5678", 4));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012345678", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(string);
}